

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

UnitsPtr __thiscall libcellml::Variable::units(Variable *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  UnitsPtr UVar1;
  
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(in_RSI + 8) + 0x110));
  UVar1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  UVar1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Variable::units() const
{
    return pFunc()->mUnits;
}